

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value_list.cpp
# Opt level: O2

Am_Value_List * __thiscall
Am_Value_List::Append_New(Am_Value_List *this,Am_Value_List *other_value,bool unique)

{
  bool bVar1;
  Am_Value_List_Data *this_00;
  Am_Value *in_value;
  Am_Value v;
  
  if (this->data == (Am_Value_List_Data *)0x0) {
    this_00 = (Am_Value_List_Data *)operator_new(0x20);
    Am_Value_List_Data::Am_Value_List_Data(this_00);
    this->data = this_00;
  }
  else if (unique) {
    Am_Value_List_Data::Make_Unique(this->data,&this->data,&this->item);
  }
  v.type = 0;
  v.value.wrapper_value = (Am_Wrapper *)0x0;
  if (other_value->data != (Am_Value_List_Data *)0x0) {
    other_value->item = other_value->data->head;
  }
  while (other_value->item != (Am_List_Item *)0x0) {
    in_value = Get(other_value);
    Am_Value::operator=(&v,in_value);
    bVar1 = Start_Member(this,&v);
    if (!bVar1) {
      Add(this,&v,Am_TAIL,false);
    }
    Next(other_value);
  }
  Am_Value::~Am_Value(&v);
  return this;
}

Assistant:

Am_Value_List &
Am_Value_List::Append_New(Am_Value_List &other_value, bool unique)
{
  if (data) {
    if (unique)
      data->Make_Unique(data, item);
  } else
    data = new Am_Value_List_Data();
  Am_Value v;
  for (other_value.Start(); !other_value.Last(); other_value.Next()) {
    v = other_value.Get();
    if (!Start_Member(v))
      Add(v, Am_TAIL, false); //only need to make me unique once
  }
  return *this;
}